

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

void qpdf_oh_make_direct(qpdf_data qpdf,qpdf_oh oh)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1573:31)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1573:31)>
             ::_M_manager;
  do_with_oh_void(qpdf,oh,(function<void_(QPDFObjectHandle_&)> *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

void
qpdf_oh_make_direct(qpdf_data qpdf, qpdf_oh oh)
{
    do_with_oh_void(qpdf, oh, [](QPDFObjectHandle& o) {
        QTC::TC("qpdf", "qpdf-c called qpdf_oh_make_direct");
        o.makeDirect();
    });
}